

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t validation_layer::logAndPropagateResult(char *fname,ze_result_t result)

{
  char *pcVar1;
  element_type *this;
  allocator local_c9;
  string local_c8 [48];
  loader local_98 [32];
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  ze_result_t local_14;
  char *pcStack_10;
  ze_result_t result_local;
  char *fname_local;
  
  local_14 = result;
  if (result != ZE_RESULT_SUCCESS) {
    pcStack_10 = fname;
    this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(context + 0xd50));
    loader::to_string_abi_cxx11_(local_98,local_14);
    std::operator+((char *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Error (");
    std::operator+(local_58,(char *)local_78);
    pcVar1 = pcStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
    std::operator+(local_38,local_58);
    loader::Logger::log_trace(this,local_38);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)local_98);
  }
  return local_14;
}

Assistant:

static ze_result_t logAndPropagateResult(const char* fname, ze_result_t result) {
        if (result != ZE_RESULT_SUCCESS) {
            context.logger->log_trace("Error (" + loader::to_string(result) + ") in " + std::string(fname));
        }
        return result;
    }